

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

void __thiscall
vkt::texture::util::TextureBinding::TextureBinding
          (TextureBinding *this,Context *context,TestTextureSp *textureData,Type type)

{
  Type type_local;
  TestTextureSp *textureData_local;
  Context *context_local;
  TextureBinding *this_local;
  
  this->m_context = context;
  this->m_type = type;
  de::SharedPtr<vkt::pipeline::TestTexture>::SharedPtr(&this->m_textureData,textureData);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_textureImage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_textureImageMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_textureImageView);
  updateTextureData(this,&this->m_textureData,this->m_type);
  return;
}

Assistant:

TextureBinding::TextureBinding (Context& context, const TestTextureSp& textureData, const TextureBinding::Type type)
	: m_context			(context)
	, m_type			(type)
	, m_textureData		(textureData)
{
	updateTextureData(m_textureData, m_type);
}